

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr
xmlLoadResource(xmlParserCtxtPtr ctxt,char *url,char *publicId,xmlResourceType type)

{
  int code;
  xmlChar *pxVar1;
  xmlParserInputPtr pxVar2;
  xmlParserInputPtr local_30;
  
  if (url != (char *)0x0) {
    if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->resourceLoader != (xmlResourceLoader)0x0)) {
      pxVar1 = xmlResolveResourceFromCatalog(url,publicId,ctxt);
      if (pxVar1 != (xmlChar *)0x0) {
        url = (char *)pxVar1;
      }
      code = (*ctxt->resourceLoader)
                       (ctxt->resourceCtxt,url,publicId,type,
                        ((uint)ctxt->options >> 7 & 0x10 | (uint)ctxt->options >> 0x15 & 8) ^ 0x10,
                        &local_30);
      if (code != 0) {
        xmlCtxtErrIO(ctxt,code,url);
        local_30 = (xmlParserInputPtr)0x0;
      }
      if (pxVar1 == (xmlChar *)0x0) {
        return local_30;
      }
      (*xmlFree)(pxVar1);
      return local_30;
    }
    pxVar1 = xmlCanonicPath((xmlChar *)url);
    if (pxVar1 != (xmlChar *)0x0) {
      pxVar2 = (*xmlCurrentExternalEntityLoader)((char *)pxVar1,publicId,ctxt);
      (*xmlFree)(pxVar1);
      return pxVar2;
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlLoadResource(xmlParserCtxtPtr ctxt, const char *url, const char *publicId,
                xmlResourceType type) {
    char *canonicFilename;
    xmlParserInputPtr ret;

    if (url == NULL)
        return(NULL);

    if ((ctxt != NULL) && (ctxt->resourceLoader != NULL)) {
        char *resource = NULL;
        int flags = 0;
        int code;

#ifdef LIBXML_CATALOG_ENABLED
        resource = (char *) xmlResolveResourceFromCatalog(url, publicId, ctxt);
        if (resource != NULL)
            url = resource;
#endif

        if (ctxt->options & XML_PARSE_UNZIP)
            flags |= XML_INPUT_UNZIP;
        if ((ctxt->options & XML_PARSE_NONET) == 0)
            flags |= XML_INPUT_NETWORK;

        code = ctxt->resourceLoader(ctxt->resourceCtxt, url, publicId, type,
                                    flags, &ret);
        if (code != XML_ERR_OK) {
            xmlCtxtErrIO(ctxt, code, url);
            ret = NULL;
        }
        if (resource != NULL)
            xmlFree(resource);
        return(ret);
    }

    canonicFilename = (char *) xmlCanonicPath((const xmlChar *) url);
    if (canonicFilename == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    ret = xmlCurrentExternalEntityLoader(canonicFilename, publicId, ctxt);
    xmlFree(canonicFilename);
    return(ret);
}